

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_manager.cpp
# Opt level: O0

void __thiscall
cfd::core::CfdCoreManager::Initialize(CfdCoreManager *this,CfdCoreHandle *handle_address)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this_00;
  size_type bytes_len;
  CfdSourceLocation *source;
  mutex_type *in_stack_fffffffffffffeb8;
  lock_guard<std::mutex> *in_stack_fffffffffffffec0;
  string *in_stack_fffffffffffffed0;
  string *message;
  undefined8 in_stack_fffffffffffffed8;
  CfdError CVar3;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  CfdException *in_stack_fffffffffffffee0;
  CfdSourceLocation *local_d0;
  int *handle;
  string local_c0 [36];
  int local_9c;
  undefined1 local_98 [4];
  int wally_ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  lock_guard<std::mutex> lock;
  string local_70 [35];
  undefined1 local_4d;
  allocator local_39;
  string local_38 [32];
  CfdCoreHandle *local_18;
  CfdCoreHandle *handle_address_local;
  CfdCoreManager *this_local;
  
  CVar3 = (CfdError)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_18 = handle_address;
  handle_address_local = &this->_vptr_CfdCoreManager;
  if (handle_address == (CfdCoreHandle *)0x0) {
    local_4d = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_38,"cfd::core::Initialize parameter NULL.",&local_39);
    CfdException::CfdException(in_stack_fffffffffffffee0,CVar3,in_stack_fffffffffffffed0);
    local_4d = 0;
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((this->finalized_ & 1U) == 0) {
    ::std::lock_guard<std::mutex>::lock_guard(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (((this->initialized_ & 1U) == 0) &&
       (bVar1 = ::std::vector<int_*,_std::allocator<int_*>_>::empty(&this->handle_list_), bVar1)) {
      InitializeLogger();
      wally_init(0);
      RandomNumberUtil::GetRandomBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98,0x20);
      this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_98;
      this_00 = (CfdException *)
                ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x704ae8);
      bytes_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_01);
      CVar3 = (CfdError)((ulong)this_01 >> 0x20);
      local_9c = wally_secp_randomize((uchar *)this_00,bytes_len);
      if (local_9c != 0) {
        handle._6_1_ = 1;
        uVar2 = __cxa_allocate_exception(0x30);
        message = (string *)((long)&handle + 7);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_c0,"Failed to secp_randomize error.",(allocator *)message);
        CfdException::CfdException(this_00,CVar3,message);
        handle._6_1_ = 0;
        __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
      }
      this->initialized_ = true;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffed0)
      ;
    }
    source = (CfdSourceLocation *)operator_new__(4);
    local_d0 = source;
    ::std::vector<int_*,_std::allocator<int_*>_>::push_back
              (&this->handle_list_,(value_type *)&local_d0);
    *local_18 = local_d0;
    strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_manager.cpp"
            ,0x2f);
    logger::info<void*&>(source,(char *)in_stack_fffffffffffffeb8,(void **)0x704cd8);
    ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x704ce3);
    return;
  }
  lock._M_device._6_1_ = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_70,"cfd::core::Initialize already finalized.",
             (allocator *)((long)&lock._M_device + 7));
  CfdException::CfdException(in_stack_fffffffffffffee0,CVar3,in_stack_fffffffffffffed0);
  lock._M_device._6_1_ = 0;
  __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void CfdCoreManager::Initialize(CfdCoreHandle* handle_address) {
  if (handle_address == nullptr) {
    throw CfdException(
        kCfdIllegalArgumentError, "cfd::core::Initialize parameter NULL.");
  }
  if (finalized_) {
    throw CfdException(
        kCfdIllegalStateError, "cfd::core::Initialize already finalized.");
  }

  {
    // Start of exclusive control
    std::lock_guard<std::mutex> lock(mutex_);
    if ((!initialized_) && handle_list_.empty()) {
      // Perform initialization processing.
      InitializeLogger();

      // Since libwally does not produce errors other than its arguments,
      // will only call the function.
      wally_init(0);

      std::vector<uint8_t> data =
          RandomNumberUtil::GetRandomBytes(WALLY_SECP_RANDOMIZE_LEN);
      int wally_ret = wally_secp_randomize(data.data(), data.size());
      if (wally_ret != WALLY_OK) {
        throw CfdException(
            kCfdIllegalStateError, "Failed to secp_randomize error.");
      }
#if 0
      int wally_ret = wally_init(0);
      if (wally_ret != WALLY_OK) {
        throw CfdException(kCfdInternalError,
                           "cfd::core::Initialize parameter NULL.");
      }
#endif

#if 0
      int hidapi_ret = hid_init();
      if (hidapi_ret != 0) {
        error(CFD_LOG_SOURCE, "hid_init error.");
        // TBD:
        // With the error of HIDAPI, should error be ignored?
        // → Pass thru core, check separately the wallet side.
        // throw CfdException(kCfdInternalError, "hid_init error.");
      }
#endif

      initialized_ = true;
    }

    // Generation and registration of handle
    int* handle = new int[1];
    handle_list_.push_back(handle);
    *handle_address = static_cast<void*>(handle);
    info(CFD_LOG_SOURCE, "core initialize. addr={:p}.", *handle_address);
  }
}